

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>,std::error_code>,ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>>
               (binder1<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>,_std::error_code>
                *function,
               SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler> *context)

{
  SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler> *context_local;
  binder1<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>,_std::error_code>
  *function_local;
  
  ::asio::
  asio_handler_invoke<asio::detail::binder1<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>,std::error_code>>
            ((asio *)function,
             (binder1<ableton::util::SafeAsyncHandler<ableton::platforms::asio::AsioTimer::AsyncHandler>,_std::error_code>
              *)context);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}